

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O3

int comex_group_rank(comex_group_t group,int *rank)

{
  int code;
  comex_igroup_t *pcVar1;
  
  pcVar1 = comex_get_igroup_from_group(group);
  code = MPI_Group_rank(pcVar1->group,rank);
  if (code != 0) {
    comex_error("MPI_Group_rank: Failed ",code);
  }
  return 0;
}

Assistant:

int comex_group_rank(comex_group_t group, int *rank)
{
    int status;

    comex_igroup_t *igroup = comex_get_igroup_from_group(group);
    status = MPI_Group_rank(igroup->group, rank);
    if (status != MPI_SUCCESS) {
        comex_error("MPI_Group_rank: Failed ", status);
    }

    return COMEX_SUCCESS;
}